

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  LoadStoreTracking *this_00;
  Expr *pEVar1;
  Module *pMVar2;
  pointer ppDVar3;
  DataSegment *pDVar4;
  pointer pcVar5;
  pointer pNVar6;
  Node *n;
  string *psVar7;
  char cVar8;
  int iVar9;
  Type TVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  char *__function;
  pointer puVar14;
  char cVar15;
  size_t sVar16;
  pointer puVar17;
  _Alloc_hider _Var18;
  Opcode OVar19;
  undefined4 in_register_00000084;
  char cVar20;
  pointer ppDVar21;
  Address AVar22;
  string_view s;
  string index;
  Value ival;
  string __str;
  string access;
  string local_128;
  undefined1 local_108 [32];
  char *local_e8;
  undefined1 local_e0 [32];
  ulong local_c0;
  LoadStoreTracking *local_a8;
  size_type local_a0;
  char *local_98;
  undefined8 uStack_90;
  char local_88 [24];
  string local_70;
  string local_50;
  
  this_00 = &this->lst;
  OVar19.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_(&local_50,this_00,offset,addr_exp);
  if ((local_50._M_string_length != 0) &&
     (iVar9 = std::__cxx11::string::compare((char *)&local_50), iVar9 != 0)) {
    BracketIfNeeded(this,val,Indexing);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,"."
                   ,&local_50);
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_e0._0_8_);
    psVar7 = (string *)local_e0;
    _Var18._M_p = (pointer)local_e0._0_8_;
    goto LAB_00152b15;
  }
  pEVar1 = addr_exp->e;
  local_a0 = local_50._M_string_length;
  if ((pEVar1 == (Expr *)0x0) || (pEVar1->type_ != Const)) {
LAB_00152324:
    sVar16 = 0;
    bVar12 = false;
  }
  else {
    iVar9 = (int)pEVar1[1].loc.filename.size_;
    if (iVar9 == -2) {
      sVar16 = pEVar1[1].loc.field_1.field_1.offset;
    }
    else {
      if (iVar9 != -1) goto LAB_00152324;
      sVar16 = (size_t)(uint)pEVar1[1].loc.field_1.field_0.line;
    }
    bVar12 = true;
  }
  local_a8 = this_00;
  if (bVar12) {
    pMVar2 = (this->mc).module;
    ppDVar21 = (pMVar2->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppDVar3 = (pMVar2->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppDVar21 != ppDVar3) {
      puVar17 = (pointer)(sVar16 + offset);
      do {
        pDVar4 = *ppDVar21;
        if ((pDVar4->offset).size_ == 1) {
          pEVar1 = (pDVar4->offset).first_;
          bVar12 = true;
          if ((pEVar1 == (Expr *)0x0) || (pEVar1->type_ != Const)) {
LAB_001523a0:
            puVar14 = (pointer)0x0;
          }
          else {
            iVar9 = (int)pEVar1[1].loc.filename.size_;
            if (iVar9 == -2) {
              puVar14 = *(pointer *)&pEVar1[1].loc.field_1;
            }
            else {
              if (iVar9 != -1) goto LAB_001523a0;
              puVar14 = (pointer)(ulong)(uint)pEVar1[1].loc.field_1.field_0.line;
            }
            bVar12 = false;
          }
          if (((!bVar12) && (puVar14 <= puVar17)) &&
             (puVar17 < (pDVar4->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                        ((long)puVar14 -
                        (long)(pDVar4->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start))) {
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            pcVar5 = (pDVar4->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar5,pcVar5 + (pDVar4->name)._M_string_length);
            local_88[0] = '\0';
            local_88[1] = '\0';
            local_88[2] = '\0';
            local_88[3] = '\0';
            local_88[4] = '\0';
            local_88[5] = '\0';
            local_88[6] = '\0';
            local_88[7] = '\0';
            local_98 = (char *)0x0;
            uStack_90 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_98,&local_128,local_108);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_98);
            local_e0._24_4_ = Atomic;
            local_108._0_8_ =
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_108._8_8_ =
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_108._16_8_ =
                 (val->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._0_8_;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e0._8_8_;
            (val->v).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0._16_8_;
            local_e0._0_16_ = ZEXT816(0);
            local_e0._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108);
            val->precedence = local_e0._24_4_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_98);
            offset = (long)puVar17 - (long)puVar14;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
        }
        ppDVar21 = ppDVar21 + 1;
      } while (ppDVar21 != ppDVar3);
    }
  }
  uVar11 = offset / align;
  if (offset % align == 0) {
    cVar15 = '\x01';
    if (9 < uVar11) {
      uVar13 = uVar11;
      cVar20 = '\x04';
      do {
        cVar15 = cVar20;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001526ba;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001526ba;
        }
        if (uVar13 < 10000) goto LAB_001526ba;
        bVar12 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar20 = cVar15 + '\x04';
      } while (bVar12);
      cVar15 = cVar15 + '\x01';
    }
LAB_001526ba:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar11);
  }
  else {
    cVar20 = '\x01';
    cVar15 = '\x01';
    if (9 < offset) {
      uVar11 = offset;
      cVar8 = '\x04';
      do {
        cVar15 = cVar8;
        if (uVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001525e3;
        }
        if (uVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001525e3;
        }
        if (uVar11 < 10000) goto LAB_001525e3;
        bVar12 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar8 = cVar15 + '\x04';
      } while (bVar12);
      cVar15 = cVar15 + '\x01';
    }
LAB_001525e3:
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_108,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108._0_8_,local_108._8_4_,offset)
    ;
    if (9 < align) {
      AVar22 = align;
      cVar15 = '\x04';
      do {
        cVar20 = cVar15;
        if (AVar22 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_00152663;
        }
        if (AVar22 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_00152663;
        }
        if (AVar22 < 10000) goto LAB_00152663;
        bVar12 = 99999 < AVar22;
        AVar22 = AVar22 / 10000;
        cVar15 = cVar20 + '\x04';
      } while (bVar12);
      cVar20 = cVar20 + '\x01';
    }
LAB_00152663:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_98,(uint)uStack_90,align);
    cat<std::__cxx11::string,char[2],std::__cxx11::string>
              (&local_128,(wabt *)local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b5e16,
               (char (*) [2])&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar19.enum_));
  }
  if (offset % align != 0) {
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
  }
  if (addr_exp->etype == Binary) {
    if (addr_exp->e->type_ != Binary) {
LAB_00152b47:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_00152b5c:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                    ,0x48,__function);
    }
    if ((*(int *)&addr_exp->e->field_0x3c == 0x5e) &&
       (pNVar6 = (addr_exp->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start, pNVar6[1].etype == Binary)) {
      if ((pNVar6[1].e)->type_ != Binary) goto LAB_00152b47;
      if ((*(int *)&(pNVar6[1].e)->field_0x3c == 0x68) &&
         (n = pNVar6[1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
              .super__Vector_impl_data._M_start, n[1].etype == Const)) {
        pEVar1 = n[1].e;
        if (pEVar1->type_ != Const) {
          __function = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
          goto LAB_00152b5c;
        }
        if (((int)pEVar1[1].loc.filename.size_ == -1) &&
           (1L << (pEVar1[1].loc.field_1.field2[0] & 0x3f) == align)) {
          DecompileExpr((Value *)local_e0,this,n,pNVar6 + 1);
          if (local_e0._8_8_ - local_e0._0_8_ == 0x20) {
            if (offset == 0) {
              std::__cxx11::string::_M_assign((string *)&local_128);
            }
            else {
              BracketIfNeeded(this,(Value *)local_e0,Add);
              cat<std::__cxx11::string,char[4],std::__cxx11::string>
                        (&local_70,(wabt *)local_e0._0_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                         (char (*) [4])&local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000084,OVar19.enum_));
              std::__cxx11::string::operator=((string *)&local_128,(string *)&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
            }
            DecompileExpr((Value *)&local_70,this,
                          (addr_exp->children).
                          super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                          super__Vector_impl_data._M_start,addr_exp);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&val->v,&local_70);
            val->precedence = local_70.field_2._8_4_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_70);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e0);
        }
      }
    }
  }
  BracketIfNeeded(this,val,Indexing);
  cat<char[2],std::__cxx11::string,char[2]>
            ((string *)local_e0,(wabt *)0x1abdb1,(char (*) [2])&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b7331,
             (char (*) [2])CONCAT44(in_register_00000084,OVar19.enum_));
  std::__cxx11::string::_M_append
            ((char *)((val->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1),local_e0._0_8_);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_);
  }
  if (local_a0 == 0) {
    local_e8 = (char *)CONCAT44(local_e8._4_4_,opc.enum_);
    if ((uint)op_type.enum_ < 0xfffffffe) {
LAB_001529cf:
      TVar10.enum_ = op_type.enum_;
    }
    else {
      Opcode::GetInfo((Info *)local_e0,(Opcode *)&local_e8);
      local_70._M_dataplus._M_p = (pointer)local_e0._0_8_;
      local_70._M_string_length = strlen((char *)local_e0._0_8_);
      local_e0._0_16_ =
           (undefined1  [16])
           string_view::substr((string_view *)&local_70,local_70._M_string_length - 2,
                               0xffffffffffffffff);
      s.size_ = 2;
      s.data_ = "_u";
      iVar9 = string_view::compare((string_view *)local_e0,s);
      Opcode::GetInfo((Info *)local_e0,(Opcode *)&local_e8);
      if (local_c0 == 4) {
        local_c0 = (ulong)(-(uint)(iVar9 != 0) | 7);
LAB_001529c0:
        bVar12 = false;
      }
      else {
        if (local_c0 == 2) {
          local_c0 = 0xfffffff9;
          if (iVar9 == 0) {
            local_c0 = 6;
          }
          goto LAB_001529c0;
        }
        if (local_c0 == 1) {
          local_c0 = 0xfffffffa;
          if (iVar9 == 0) {
            local_c0 = 4;
          }
          bVar12 = false;
        }
        else {
          bVar12 = true;
        }
      }
      TVar10.enum_ = (Enum)local_c0;
      if (bVar12) goto LAB_001529cf;
    }
    switch(TVar10.enum_) {
    case I8U:
      local_e8 = "ubyte";
      break;
    case I16U:
      local_e8 = "ushort";
      break;
    case I32U:
      local_e8 = "uint";
      break;
    case ExnRef:
      local_e8 = "exnref";
      break;
    case 0xffffffe9:
    case 0xffffffea:
    case 0xffffffeb:
    case ExnRef|I8U:
    case 0xffffffed:
    case ExnRef|I16U:
    case 0xfffffff1:
    case 0xfffffff2:
    case 0xfffffff3:
    case FuncRef|I8U:
    case 0xfffffff5:
    case FuncRef|I16U:
    case FuncRef|I32U:
    case ~I32U:
    case Any:
    case ~I64:
    case ~F32:
    case ~F64:
    case ~I8:
switchD_001529e7_caseD_ffffffe9:
      local_e8 = "ILLEGAL";
      break;
    case ExternRef:
      local_e8 = "externref";
      break;
    case FuncRef:
      local_e8 = "funcref";
      break;
    case I16:
      local_e8 = "short";
      break;
    case I8:
      local_e8 = "byte";
      break;
    case V128:
      local_e8 = "simd";
      break;
    case F64:
      local_e8 = "double";
      break;
    case F32:
      local_e8 = "float";
      break;
    case I64:
      local_e8 = "long";
      break;
    case I32:
      local_e8 = "int";
      break;
    default:
      if (TVar10.enum_ == Void) {
        local_e8 = "void";
      }
      else {
        if (TVar10.enum_ != Func) goto switchD_001529e7_caseD_ffffffe9;
        local_e8 = "func";
      }
    }
    LoadStoreTracking::GenAlign_abi_cxx11_(&local_70,local_a8,align,opc);
    cat<char[2],char_const*,std::__cxx11::string>
              ((string *)local_e0,(wabt *)":",(char (*) [2])&local_e8,(char **)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,OVar19.enum_));
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_e0._0_8_);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  val->precedence = Indexing;
  psVar7 = &local_128;
  _Var18._M_p = local_128._M_dataplus._M_p;
LAB_00152b15:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var18._M_p != &psVar7->field_2) {
    operator_delete(_Var18._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadStore(Value &val, const Node& addr_exp, uint64_t offset,
                  Opcode opc, Address align, Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base &&
            abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value { { dat->name }, Precedence::Atomic };
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                ? std::to_string(offset / align)
                : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add &&
          shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl &&
            const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() +=
        cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
            lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }